

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_statement.cc
# Opt level: O3

shared_ptr<const_tchecker::lvalue_expression_t> __thiscall
tchecker::typed_int_to_clock_assign_statement_t::clock_ptr
          (typed_int_to_clock_assign_statement_t *this)

{
  long lVar1;
  shared_ptr<const_tchecker::typed_lvalue_expression_t> sVar2;
  shared_ptr<const_tchecker::lvalue_expression_t> sVar3;
  long *local_20 [2];
  
  sVar2 = typed_assign_statement_t::lvalue_ptr((typed_assign_statement_t *)local_20);
  sVar3.super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount = sVar2.
                super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  if (local_20[0] == (long *)0x0) {
    lVar1 = 0;
  }
  else {
    lVar1 = (long)local_20[0] + *(long *)(*local_20[0] + -0x40);
  }
  *(long *)&(this->super_typed_assign_statement_t).super_typed_statement_t = lVar1;
  *(long **)&(this->super_typed_assign_statement_t).super_typed_statement_t._type = local_20[1];
  sVar3.super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_tchecker::lvalue_expression_t>)
         sVar3.super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<tchecker::lvalue_expression_t const> typed_int_to_clock_assign_statement_t::clock_ptr() const
{
  return lvalue_ptr();
}